

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O1

Node * __thiscall
anon_unknown.dwarf_38a::NinjaMain::CollectTarget(NinjaMain *this,char *cpath,string *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppEVar2;
  Edge *this_00;
  pointer ppNVar3;
  StringPiece path_00;
  bool bVar4;
  int iVar5;
  Node *pNVar6;
  long *plVar7;
  size_type *psVar8;
  long *plVar9;
  string path;
  uint64_t slash_bits;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  uint64_t local_58;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,cpath,(allocator<char> *)&local_b8);
  bVar4 = CanonicalizePath(&local_78,&local_58,err);
  if (bVar4) {
    if ((local_78._M_string_length == 0) ||
       (local_78._M_dataplus._M_p[local_78._M_string_length - 1] != '^')) {
      bVar4 = false;
    }
    else {
      bVar4 = true;
      std::__cxx11::string::resize((ulong)&local_78,(char)local_78._M_string_length + -1);
    }
    path_00.len_ = local_78._M_string_length;
    path_00.str_ = local_78._M_dataplus._M_p;
    pNVar6 = State::LookupNode(&this->state_,path_00);
    if (pNVar6 == (Node *)0x0) {
      Node::PathDecanonicalized(&local_50,&local_78,local_58);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1234a3);
      paVar1 = &local_98.field_2;
      psVar8 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_98.field_2._M_allocated_capacity = *psVar8;
        local_98.field_2._8_8_ = plVar7[3];
        local_98._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar8;
        local_98._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_98._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_98);
      plVar9 = plVar7 + 2;
      if ((long *)*plVar7 == plVar9) {
        local_a8 = *plVar9;
        lStack_a0 = plVar7[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *plVar9;
        local_b8 = (long *)*plVar7;
      }
      local_b0 = plVar7[1];
      *plVar7 = (long)plVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)err,(string *)&local_b8);
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      iVar5 = std::__cxx11::string::compare((char *)&local_78);
      if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)&local_78), iVar5 == 0)) {
        std::__cxx11::string::append((char *)err);
      }
      else {
        pNVar6 = State::SpellcheckNode(&this->state_,&local_78);
        if (pNVar6 != (Node *)0x0) {
          std::operator+(&local_98,", did you mean \'",&pNVar6->path_);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_98);
          plVar9 = plVar7 + 2;
          if ((long *)*plVar7 == plVar9) {
            local_a8 = *plVar9;
            lStack_a0 = plVar7[3];
            local_b8 = &local_a8;
          }
          else {
            local_a8 = *plVar9;
            local_b8 = (long *)*plVar7;
          }
          local_b0 = plVar7[1];
          *plVar7 = (long)plVar9;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::_M_append((char *)err,(ulong)local_b8);
          if (local_b8 != &local_a8) {
            operator_delete(local_b8,local_a8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar1) goto LAB_0010831b;
        }
      }
    }
    else {
      if (!bVar4) goto LAB_0010832b;
      ppEVar2 = (pNVar6->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (ppEVar2 !=
          (pNVar6->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this_00 = *ppEVar2;
        ppNVar3 = (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (ppNVar3 ==
            (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          Edge::Dump(this_00,"");
          Fatal("edge has no outputs");
        }
        pNVar6 = *ppNVar3;
        goto LAB_0010832b;
      }
      std::operator+(&local_98,"\'",&local_78);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_98);
      plVar9 = plVar7 + 2;
      if ((long *)*plVar7 == plVar9) {
        local_a8 = *plVar9;
        lStack_a0 = plVar7[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *plVar9;
        local_b8 = (long *)*plVar7;
      }
      local_b0 = plVar7[1];
      *plVar7 = (long)plVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)err,(string *)&local_b8);
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
LAB_0010831b:
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
    }
  }
  pNVar6 = (Node *)0x0;
LAB_0010832b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return pNVar6;
}

Assistant:

Node* NinjaMain::CollectTarget(const char* cpath, string* err) {
  string path = cpath;
  uint64_t slash_bits;
  if (!CanonicalizePath(&path, &slash_bits, err))
    return NULL;

  // Special syntax: "foo.cc^" means "the first output of foo.cc".
  bool first_dependent = false;
  if (!path.empty() && path[path.size() - 1] == '^') {
    path.resize(path.size() - 1);
    first_dependent = true;
  }

  Node* node = state_.LookupNode(path);
  if (node) {
    if (first_dependent) {
      if (node->out_edges().empty()) {
        *err = "'" + path + "' has no out edge";
        return NULL;
      }
      Edge* edge = node->out_edges()[0];
      if (edge->outputs_.empty()) {
        edge->Dump();
        Fatal("edge has no outputs");
      }
      node = edge->outputs_[0];
    }
    return node;
  } else {
    *err =
        "unknown target '" + Node::PathDecanonicalized(path, slash_bits) + "'";
    if (path == "clean") {
      *err += ", did you mean 'ninja -t clean'?";
    } else if (path == "help") {
      *err += ", did you mean 'ninja -h'?";
    } else {
      Node* suggestion = state_.SpellcheckNode(path);
      if (suggestion) {
        *err += ", did you mean '" + suggestion->path() + "'?";
      }
    }
    return NULL;
  }
}